

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterOutputNSDecl(xmlTextWriterPtr writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  xmlLinkPtr lk;
  undefined8 *puVar4;
  xmlChar *content;
  xmlChar *name;
  
  iVar3 = 0;
  do {
    iVar2 = xmlListEmpty(writer->nsstack);
    if (iVar2 != 0) {
      return iVar3;
    }
    lk = xmlListFront(writer->nsstack);
    puVar4 = (undefined8 *)xmlLinkGetData(lk);
    if (puVar4 == (undefined8 *)0x0) {
      content = (xmlChar *)0x0;
      name = (xmlChar *)0x0;
    }
    else {
      content = xmlStrdup((xmlChar *)puVar4[1]);
      name = xmlStrdup((xmlChar *)*puVar4);
    }
    xmlListPopFront(writer->nsstack);
    bVar1 = true;
    if (puVar4 != (undefined8 *)0x0) {
      iVar2 = xmlTextWriterWriteAttribute(writer,name,content);
      (*xmlFree)(content);
      (*xmlFree)(name);
      if (iVar2 < 0) {
        xmlListDelete(writer->nsstack);
        writer->nsstack = (xmlListPtr)0x0;
        bVar1 = false;
      }
      else {
        iVar3 = iVar3 + iVar2;
      }
    }
  } while (bVar1);
  return -1;
}

Assistant:

static int
xmlTextWriterOutputNSDecl(xmlTextWriterPtr writer)
{
    xmlLinkPtr lk;
    xmlTextWriterNsStackEntry *np;
    int count;
    int sum;

    sum = 0;
    while (!xmlListEmpty(writer->nsstack)) {
        xmlChar *namespaceURI = NULL;
        xmlChar *prefix = NULL;

        lk = xmlListFront(writer->nsstack);
        np = (xmlTextWriterNsStackEntry *) xmlLinkGetData(lk);

        if (np != 0) {
            namespaceURI = xmlStrdup(np->uri);
            prefix = xmlStrdup(np->prefix);
        }

        xmlListPopFront(writer->nsstack);

        if (np != 0) {
            count = xmlTextWriterWriteAttribute(writer, prefix, namespaceURI);
            xmlFree(namespaceURI);
            xmlFree(prefix);

            if (count < 0) {
                xmlListDelete(writer->nsstack);
                writer->nsstack = NULL;
                return -1;
            }
            sum += count;
        }
    }
    return sum;
}